

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O1

int pg::switch_strategy_SYNC_SLOW(WorkerP *w,Task *__dq_head)

{
  atomic<unsigned_int> *paVar1;
  Task *__dq_head_00;
  Worker *pWVar2;
  ulong uVar3;
  int iVar4;
  
  if ((w->allstolen == '\0') &&
     ((w->split <= __dq_head || (iVar4 = lace_shrink_shared(w), iVar4 == 0)))) {
    pWVar2 = w->_public;
    if (pWVar2->movesplit != '\0') {
      uVar3 = ((long)__dq_head - (long)w->split >> 6) + 1U >> 1;
      w->split = w->split + uVar3;
      LOCK();
      paVar1 = &(pWVar2->ts).ts.split;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + (int)uVar3;
      UNLOCK();
      pWVar2->movesplit = '\0';
    }
    (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
    iVar4 = PSISolver::switch_strategy
                      (*(PSISolver **)__dq_head->d,w,__dq_head,*(int *)(__dq_head->d + 8),
                       *(int *)(__dq_head->d + 0xc),*(int *)(__dq_head->d + 0x10));
    return iVar4;
  }
  pWVar2 = (__dq_head->thief)._M_b._M_p;
  if (pWVar2 != (Worker *)0x2) {
    while (pWVar2 < (Worker *)0x2) {
      pWVar2 = (__dq_head->thief)._M_b._M_p;
    }
    if (pWVar2 != (Worker *)0x2) {
      __dq_head_00 = __dq_head + 1;
      iVar4 = 0x20;
      do {
        pWVar2 = lace_steal(w,__dq_head_00,pWVar2);
        if (pWVar2 == (Worker *)0x2) {
          if (lace_newframe.t != (Task *)0x0) {
            lace_yield(w,__dq_head_00);
          }
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            lace_steal_random_CALL(w,__dq_head_00);
            iVar4 = 0x20;
          }
        }
        pWVar2 = (__dq_head->thief)._M_b._M_p;
      } while (pWVar2 != (Worker *)0x2);
    }
    if (w->allstolen == '\0') {
      w->_public->allstolen = '\x01';
      w->allstolen = '\x01';
    }
  }
  (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
  return *(int *)__dq_head->d;
}

Assistant:

TASK_4(int, switch_strategy, PSISolver*, s, int, pl, int, begin, int, count)
{
    return s->switch_strategy(__lace_worker, __lace_dq_head, pl, begin, count);
}